

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

int __thiscall mpt::layout::text::convert(text *this,type_t type,void *ptr)

{
  bool bVar1;
  int local_70;
  int local_6c;
  text *local_60 [2];
  object *poStack_50;
  int tx_1;
  text *ptStack_40;
  int tx;
  text *local_38;
  int local_2c;
  undefined8 *puStack_28;
  int me;
  void *ptr_local;
  type_t type_local;
  text *this_local;
  
  puStack_28 = (undefined8 *)ptr;
  ptr_local = (void *)type;
  type_local = (type_t)this;
  local_2c = type_properties<mpt::layout::text_*>::id(true);
  if (local_2c < 0) {
    local_2c = 0x100;
  }
  else {
    local_38 = this;
    bVar1 = assign<mpt::layout::text*>(&local_38,(int)ptr_local,puStack_28);
    if (bVar1) {
      return local_2c;
    }
  }
  if (ptr_local == (void *)0x0) {
    if (puStack_28 != (undefined8 *)0x0) {
      *puStack_28 = convert::fmt;
    }
    this_local._4_4_ = local_2c;
  }
  else {
    ptStack_40 = this;
    bVar1 = assign<mpt::metatype*>((metatype **)&stack0xffffffffffffffc0,(int)ptr_local,puStack_28);
    if (bVar1) {
      local_6c = type_properties<mpt::text_*>::id(true);
      if (local_6c < 1) {
        local_6c = local_2c;
      }
      this_local._4_4_ = local_6c;
    }
    else {
      poStack_50 = &this->super_object;
      bVar1 = assign<mpt::object*>(&stack0xffffffffffffffb0,(int)ptr_local,puStack_28);
      if (bVar1) {
        local_70 = type_properties<mpt::text_*>::id(true);
        if (local_70 < 1) {
          local_70 = local_2c;
        }
        this_local._4_4_ = local_70;
      }
      else {
        local_60[0] = &this->super_text;
        bVar1 = assign<mpt::text*>(local_60,(int)ptr_local,puStack_28);
        if (bVar1) {
          this_local._4_4_ = 0x84;
        }
        else {
          bVar1 = assign<mpt::color>(&(this->super_text).color,(int)ptr_local,puStack_28);
          if (bVar1) {
            this_local._4_4_ = local_2c;
          }
          else {
            this_local._4_4_ = -3;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int layout::text::convert(type_t type, void *ptr)
{
	int me = type_properties<text *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast< ::mpt::text *>(this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(color, type, ptr)) {
		return me;
	}
	return MPT_ERROR(BadType);
}